

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

void uprv_getCharNameCharacters_63(USetAdder *sa)

{
  UBool UVar1;
  uint uVar2;
  long lVar3;
  uint length;
  ulong uVar4;
  ulong uVar5;
  UErrorCode errorCode;
  char cs [256];
  UChar us [256];
  UErrorCode local_31c;
  char local_318 [256];
  UChar local_218 [256];
  
  local_31c = U_ZERO_ERROR;
  UVar1 = icu_63::calcNameSetsLengths(&local_31c);
  if (UVar1 != '\0') {
    length = 0;
    for (uVar2 = 0; uVar2 != 0x100; uVar2 = uVar2 + 1) {
      if ((*(uint *)(icu_63::gNameSet + (ulong)(uVar2 >> 5) * 4) >> (uVar2 & 0x1f) & 1) != 0) {
        lVar3 = (long)(int)length;
        length = length + 1;
        local_318[lVar3] = (char)uVar2;
      }
    }
    u_charsToUChars_63(local_318,local_218,length);
    uVar5 = 0;
    uVar4 = (ulong)length;
    if ((int)length < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      if ((local_218[uVar5] != L'\0') || (local_318[uVar5] == '\0')) {
        (*(code *)sa->add)(sa->set);
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uprv_getCharNameCharacters(const USetAdder *sa) {
    charSetToUSet(gNameSet, sa);
}